

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::string_t,duckdb::string_t,duckdb::Equals,false,true,false,true>
                (string_t *ldata,string_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  string_t *psVar9;
  unsigned_long uVar10;
  ulong uVar11;
  long lVar12;
  sel_t sVar13;
  
  if (count + 0x3f < 0x40) {
    lVar12 = 0;
  }
  else {
    lVar12 = 0;
    uVar6 = 0;
    uVar11 = 0;
    do {
      puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar1 == (unsigned_long *)0x0) {
        uVar10 = 0xffffffffffffffff;
      }
      else {
        uVar10 = puVar1[uVar6];
      }
      uVar7 = uVar11 + 0x40;
      if (count <= uVar11 + 0x40) {
        uVar7 = count;
      }
      uVar8 = uVar11;
      if (uVar10 == 0xffffffffffffffff) {
        if (uVar11 < uVar7) {
          psVar9 = ldata + uVar11;
          do {
            uVar8 = uVar11;
            if (sel->sel_vector != (sel_t *)0x0) {
              uVar8 = (ulong)sel->sel_vector[uVar11];
            }
            bVar4 = string_t::operator==(psVar9,rdata);
            false_sel->sel_vector[lVar12] = (sel_t)uVar8;
            lVar12 = lVar12 + (ulong)!bVar4;
            uVar11 = uVar11 + 1;
            psVar9 = psVar9 + 1;
            uVar8 = uVar11;
          } while (uVar7 != uVar11);
        }
      }
      else if (uVar10 == 0) {
        uVar8 = uVar7;
        if (uVar11 < uVar7) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar13 = (sel_t)uVar11;
            if (psVar2 != (sel_t *)0x0) {
              sVar13 = psVar2[uVar11];
            }
            psVar3[lVar12] = sVar13;
            lVar12 = lVar12 + 1;
            uVar11 = uVar11 + 1;
          } while (uVar7 != uVar11);
        }
      }
      else if (uVar11 < uVar7) {
        psVar9 = ldata + uVar11;
        uVar8 = 0;
        do {
          if (sel->sel_vector == (sel_t *)0x0) {
            sVar13 = (int)uVar8 + (int)uVar11;
          }
          else {
            sVar13 = sel->sel_vector[uVar11 + uVar8];
          }
          if ((uVar10 >> (uVar8 & 0x3f) & 1) == 0) {
            uVar5 = 1;
          }
          else {
            bVar4 = string_t::operator==(psVar9,rdata);
            uVar5 = (ulong)!bVar4;
          }
          false_sel->sel_vector[lVar12] = sVar13;
          lVar12 = lVar12 + uVar5;
          uVar8 = uVar8 + 1;
          psVar9 = psVar9 + 1;
        } while ((uVar11 - uVar7) + uVar8 != 0);
        uVar8 = uVar11 + uVar8;
      }
      uVar6 = uVar6 + 1;
      uVar11 = uVar8;
    } while (uVar6 != count + 0x3f >> 6);
  }
  return count - lVar12;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}